

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O1

bool Config::parse(int argc,char **argv,List<Path> *rcFiles)

{
  Type TVar1;
  undefined1 this [8];
  char **ppcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  pointer pPVar6;
  FILE *__stream;
  option *poVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  byte bVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  long *plVar16;
  bool ok;
  List<String> args;
  int idx;
  List<String> split;
  List<Config::OptionBase_*> optionPointers;
  List<Value> vals;
  String error;
  String shortOpts;
  Value val;
  StackBuffer<128UL,_char_*> a;
  StackBuffer<128UL,_option> options;
  bool local_15b9;
  vector<String,_std::allocator<String>_> local_15b8;
  int local_1594;
  undefined1 local_1590 [8];
  undefined1 local_1588 [48];
  void *local_1558;
  iterator iStack_1550;
  OptionBase **local_1548;
  uint local_153c;
  vector<Value,_std::allocator<Value>_> local_1538;
  List<Path> *local_1520;
  undefined1 *local_1518;
  long local_1510;
  undefined1 local_1508 [16];
  char **local_14f8;
  ulong local_14f0;
  String local_14e8;
  Value local_14c8;
  Value local_1490;
  String local_1458 [32];
  String *local_1058;
  undefined8 local_1050;
  option local_1048 [128];
  option *local_48;
  ulong local_40;
  
  local_1518 = local_1508;
  local_1510 = 0;
  local_1508[0] = 0;
  local_1520 = rcFiles;
  Rct::findExecutablePath(*argv);
  local_15b8.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_15b8.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_15b8.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  String::String((String *)local_1048,*argv,0xffffffffffffffff);
  local_153c = argc;
  std::vector<String,_std::allocator<String>_>::push_back(&local_15b8,(value_type *)local_1048);
  local_14f8 = argv;
  if ((int **)local_1048[0].name != &local_1048[0].flag) {
    operator_delete(local_1048[0].name);
  }
  pPVar6 = (local_1520->super_vector<Path,_std::allocator<Path>_>).
           super__Vector_base<Path,_std::allocator<Path>_>._M_impl.super__Vector_impl_data._M_start;
  if ((local_1520->super_vector<Path,_std::allocator<Path>_>).
      super__Vector_base<Path,_std::allocator<Path>_>._M_impl.super__Vector_impl_data._M_finish !=
      pPVar6) {
    uVar10 = 0;
    do {
      local_14f0 = uVar10;
      __stream = fopen(pPVar6[uVar10].super_String.mString._M_dataplus._M_p,"r");
      if (__stream != (FILE *)0x0) {
        while (iVar5 = Rct::readLine((FILE *)__stream,(char *)local_1048,0x400), iVar5 != -1) {
          pcVar13 = (char *)((long)&local_1050 + 7);
          do {
            cVar4 = pcVar13[1];
            pcVar13 = pcVar13 + 1;
            iVar5 = isspace((int)cVar4);
          } while (iVar5 != 0);
          if (cVar4 != '#') {
            String::String(local_1458,pcVar13,0xffffffffffffffff);
            String::split((List<String> *)local_1590,local_1458,' ',0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1458[0].mString._M_dataplus._M_p._1_7_,
                            local_1458[0].mString._M_dataplus._M_p._0_1_) !=
                &local_1458[0].mString.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1458[0].mString._M_dataplus._M_p._1_7_,
                                       local_1458[0].mString._M_dataplus._M_p._0_1_));
            }
            this = local_1590;
            if (local_1590 != (undefined1  [8])CONCAT71(local_1588._1_7_,local_1588[0])) {
              if ((*(ulong *)((long)local_1590 + 8) == 1) ||
                 ((2 < *(ulong *)((long)local_1590 + 8) &&
                  (*(char *)(*(long *)local_1590 + 1) == '=')))) {
                local_1458[0].mString._M_dataplus._M_p._0_1_ = 0x2d;
                std::__cxx11::string::replace((ulong)local_1590,0,(char *)0x0,(ulong)local_1458);
              }
              else {
                String::String(local_1458,"--",0xffffffffffffffff);
                String::prepend((String *)this,local_1458);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_1458[0].mString._M_dataplus._M_p._1_7_,
                                local_1458[0].mString._M_dataplus._M_p._0_1_) !=
                    &local_1458[0].mString.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_1458[0].mString._M_dataplus._M_p._1_7_,
                                           local_1458[0].mString._M_dataplus._M_p._0_1_));
                }
              }
              List<String>::append((List<String> *)&local_15b8,(List<String> *)local_1590);
            }
            std::vector<String,_std::allocator<String>_>::~vector
                      ((vector<String,_std::allocator<String>_> *)local_1590);
          }
        }
        fclose(__stream);
      }
      uVar10 = local_14f0 + 1;
      pPVar6 = (local_1520->super_vector<Path,_std::allocator<Path>_>).
               super__Vector_base<Path,_std::allocator<Path>_>._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar10 < (ulong)((long)(local_1520->super_vector<Path,_std::allocator<Path>_>).
                                    super__Vector_base<Path,_std::allocator<Path>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pPVar6 >> 5));
  }
  ppcVar2 = local_14f8;
  if (1 < (int)local_153c) {
    uVar14 = (ulong)local_153c;
    uVar10 = 1;
    do {
      String::String((String *)local_1048,ppcVar2[uVar10],0xffffffffffffffff);
      std::vector<String,_std::allocator<String>_>::emplace_back<String>
                (&local_15b8,(String *)local_1048);
      if ((int **)local_1048[0].name != &local_1048[0].flag) {
        operator_delete(local_1048[0].name);
      }
      uVar10 = uVar10 + 1;
    } while (uVar14 != uVar10);
  }
  local_1050 = (long)local_15b8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_15b8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5;
  local_1058 = (String *)0x0;
  if (local_1050 < 0x81) {
    local_1058 = local_1458;
  }
  else {
    local_1058 = (String *)
                 operator_new__(-(ulong)(local_1050 >> 0x3d != 0) |
                                (long)local_15b8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_15b8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2);
  }
  if (local_15b8.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      local_15b8.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    lVar12 = 0;
    lVar15 = 0;
    uVar10 = 0;
    do {
      pcVar13 = strdup(*(char **)((long)&((local_15b8.
                                           super__Vector_base<String,_std::allocator<String>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->mString).
                                         _M_dataplus._M_p + lVar15));
      *(char **)((long)&(local_1058->mString)._M_dataplus._M_p + (lVar12 >> 0x1d)) = pcVar13;
      uVar10 = uVar10 + 1;
      lVar15 = lVar15 + 0x20;
      lVar12 = lVar12 + 0x100000000;
    } while (uVar10 < (ulong)((long)local_15b8.super__Vector_base<String,_std::allocator<String>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_15b8.super__Vector_base<String,_std::allocator<String>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_40 = ((long)sOptions.
                    super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                    super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)sOptions.
                    super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                    super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1;
  local_48 = (option *)0x0;
  poVar7 = local_1048;
  if (0x80 < local_40) {
    poVar7 = (option *)operator_new__(-(ulong)(local_40 >> 0x3b != 0) | local_40 * 0x20);
  }
  local_1558 = (void *)0x0;
  iStack_1550._M_current = (OptionBase **)0x0;
  local_1548 = (OptionBase **)0x0;
  local_48 = poVar7;
  if (sOptions.super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
      super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      sOptions.super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
      super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      local_1590 = (undefined1  [8])
                   sOptions.
                   super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                   super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10];
      if (*(long *)((long)local_1590 + 8) != 0) {
        poVar7 = local_48 + (int)((ulong)((long)iStack_1550._M_current - (long)local_1558) >> 3);
        if (iStack_1550._M_current == local_1548) {
          std::vector<Config::OptionBase*,std::allocator<Config::OptionBase*>>::
          _M_realloc_insert<Config::OptionBase*const&>
                    ((vector<Config::OptionBase*,std::allocator<Config::OptionBase*>> *)&local_1558,
                     iStack_1550,(OptionBase **)local_1590);
        }
        else {
          *iStack_1550._M_current = (OptionBase *)local_1590;
          iStack_1550._M_current = iStack_1550._M_current + 1;
        }
        poVar7->name = *(char **)((long)local_1590 + 8);
        poVar7->has_arg = (uint)(*(int *)((long)local_1590 + 0x38) != 2);
        poVar7->val = (int)(char)*(OptionBase *)((long)local_1590 + 0x10);
        poVar7->flag = (int *)0x0;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)sOptions.
                                    super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                                    .
                                    super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)sOptions.
                                    super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                                    .
                                    super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  iVar5 = (int)((ulong)((long)iStack_1550._M_current - (long)local_1558) >> 3);
  local_48[iVar5].flag = (int *)0x0;
  (&local_48[iVar5].flag)[1] = (int *)0x0;
  local_48[iVar5].name = (char *)0x0;
  *(undefined8 *)&local_48[iVar5].has_arg = 0;
  Rct::shortOptions(&local_14e8,local_48);
  local_15b9 = true;
  do {
    local_1594 = -1;
    iVar5 = getopt_long((ulong)((long)local_15b8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_15b8.super__Vector_base<String,_std::allocator<String>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 5,local_1058,
                        local_14e8.mString._M_dataplus._M_p,local_48,&local_1594);
    bVar11 = 0x15;
    if (iVar5 != -1) {
      if (iVar5 != 0x3f) {
        if ((long)local_1594 == -1) {
          if ((long)iStack_1550._M_current - (long)local_1558 != 0) {
            lVar12 = (long)iStack_1550._M_current - (long)local_1558 >> 3;
            lVar15 = 0;
            do {
              plVar16 = *(long **)((long)local_1558 + lVar15 * 8);
              if (iVar5 == (char)plVar16[2]) goto LAB_0013f751;
              lVar15 = lVar15 + 1;
            } while (lVar12 + (ulong)(lVar12 == 0) != lVar15);
          }
          plVar16 = (long *)0x0;
        }
        else {
          plVar16 = *(long **)((long)local_1558 + (long)local_1594 * 8);
        }
LAB_0013f751:
        if (plVar16 != (long *)0x0) {
          plVar16[0x16] = plVar16[0x16] + 1;
          pcVar13 = _optarg;
          if (_optarg == (char *)0x0) {
            if ((int)plVar16[7] != 2) {
              __assert_fail("opt->defaultValue.type() == Value::Type_Boolean",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Config.cpp"
                            ,0x99,"static bool Config::parse(int, char **, const List<Path> &)");
            }
            bVar3 = Value::convert<bool>((Value *)(plVar16 + 7),(bool *)0x0);
            local_1588[0] = !bVar3;
            local_1590._0_4_ = 2;
            Value::clear((Value *)(plVar16 + 0xe));
            Value::copy((Value *)(plVar16 + 0xe),(EVP_PKEY_CTX *)local_1590,src_00);
            Value::clear((Value *)local_1590);
          }
          else {
            local_14c8.mType = Type_Invalid;
            if (*_optarg == '=') {
              iVar5 = strcmp(*(char **)((long)local_1058 + (long)_optind * 8 + -8),_optarg);
              pcVar13 = pcVar13 + (iVar5 != 0);
            }
            TVar1 = *(Type *)(plVar16 + 0x15);
            local_1590._0_4_ = 5;
            sVar8 = strlen(pcVar13);
            String::String((String *)local_1588,pcVar13,(long)(int)sVar8);
            Value::convert(&local_1490,(Value *)local_1590,TVar1,&local_15b9);
            Value::clear((Value *)local_1590);
            Value::clear(&local_14c8);
            Value::copy(&local_14c8,(EVP_PKEY_CTX *)&local_1490,src);
            Value::clear(&local_1490);
            if (local_15b9 == false) {
              pcVar9 = "";
              if ((ulong)*(uint *)(plVar16 + 0x15) < 10) {
                pcVar9 = (&PTR_anon_var_dwarf_17b40_00190f70)[*(uint *)(plVar16 + 0x15)];
              }
              String::format<128ul>
                        ((String *)local_1590,"\"%s\" can not be converted to \"%s\" for %s",pcVar13
                         ,pcVar9,plVar16[1]);
              std::__cxx11::string::operator=((string *)&local_1518,(string *)local_1590);
              if (local_1590 != (undefined1  [8])(local_1588 + 8)) {
                operator_delete((void *)local_1590);
              }
LAB_0013fb71:
              bVar11 = 0x15;
            }
            else if ((int)plVar16[7] == 8) {
              local_1538.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1538.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1538.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<Value,_std::allocator<Value>_>::push_back(&local_1538,&local_14c8);
              uVar10 = (ulong)_optind;
              while (((uVar10 < (ulong)((long)local_15b8.
                                              super__Vector_base<String,_std::allocator<String>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_15b8.
                                              super__Vector_base<String,_std::allocator<String>_>.
                                              _M_impl.super__Vector_impl_data._M_start >> 5) &&
                      (*(&(local_1058->mString)._M_dataplus)[uVar10]._M_p != '-')) &&
                     ((plVar16[0x17] == 0 ||
                      ((ulong)(((long)local_1538.super__Vector_base<Value,_std::allocator<Value>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_1538.super__Vector_base<Value,_std::allocator<Value>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x6db6db6db6db6db7) < (ulong)plVar16[0x17]))))) {
                TVar1 = *(Type *)(plVar16 + 0x15);
                pcVar13 = (&(local_1058->mString)._M_dataplus)[uVar10]._M_p;
                local_1590._0_4_ = 5;
                sVar8 = strlen(pcVar13);
                String::String((String *)local_1588,pcVar13,(long)(int)sVar8);
                Value::convert(&local_1490,(Value *)local_1590,TVar1,&local_15b9);
                Value::clear((Value *)local_1590);
                std::vector<Value,_std::allocator<Value>_>::push_back(&local_1538,&local_1490);
                Value::clear(&local_1490);
                if (local_15b9 == false) {
                  pcVar13 = "";
                  if ((ulong)*(uint *)(plVar16 + 0x15) < 10) {
                    pcVar13 = (&PTR_anon_var_dwarf_17b40_00190f70)[*(uint *)(plVar16 + 0x15)];
                  }
                  String::format<128ul>
                            ((String *)local_1590,"\"%s\" can not be converted to \"%s\" for %s",
                             (&(local_1058->mString)._M_dataplus)[_optind]._M_p,pcVar13,plVar16[1]);
                  goto LAB_0013fb22;
                }
                uVar10 = (long)_optind + 1;
                _optind = (int)uVar10;
              }
              local_1590._0_4_ = 8;
              std::vector<Value,_std::allocator<Value>_>::vector
                        ((vector<Value,_std::allocator<Value>_> *)local_1588,&local_1538);
              Value::clear((Value *)(plVar16 + 0xe));
              Value::copy((Value *)(plVar16 + 0xe),(EVP_PKEY_CTX *)local_1590,src_02);
              Value::clear((Value *)local_1590);
              bVar11 = 0;
              bVar3 = true;
              if ((plVar16[0x17] != 0) &&
                 (((long)local_1538.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_1538.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 - plVar16[0x17]
                  != 0)) {
                local_15b9 = false;
                String::format<128ul>
                          ((String *)local_1590,
                           "Too few values specified for %s. Wanted %zu, got %zu",plVar16[1]);
LAB_0013fb22:
                std::__cxx11::string::operator=((string *)&local_1518,(string *)local_1590);
                if (local_1590 != (undefined1  [8])(local_1588 + 8)) {
                  operator_delete((void *)local_1590);
                }
                bVar11 = 0x15;
                bVar3 = false;
              }
              std::vector<Value,_std::allocator<Value>_>::~vector(&local_1538);
              if (bVar3) goto LAB_0013fb55;
            }
            else {
              Value::clear((Value *)(plVar16 + 0xe));
              Value::copy((Value *)(plVar16 + 0xe),(EVP_PKEY_CTX *)&local_14c8,src_01);
LAB_0013fb55:
              cVar4 = (**(code **)(*plVar16 + 0x10))(plVar16,&local_1518);
              bVar11 = 0;
              if (cVar4 == '\0') {
                local_15b9 = false;
                goto LAB_0013fb71;
              }
            }
            Value::clear(&local_14c8);
            if (bVar11 != 0) goto LAB_0013fb89;
          }
          bVar11 = 0;
          goto LAB_0013fb89;
        }
      }
      local_15b9 = false;
    }
LAB_0013fb89:
    if (bVar11 != 0) {
      if (bVar11 == 0x15) {
        uVar10 = (ulong)_optind;
        if (uVar10 < (ulong)((long)local_15b8.super__Vector_base<String,_std::allocator<String>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_15b8.super__Vector_base<String,_std::allocator<String>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 5)) {
          do {
            _optind = _optind + 1;
            pcVar13 = (&(local_1058->mString)._M_dataplus)[uVar10]._M_p;
            local_1590._0_4_ = 5;
            sVar8 = strlen(pcVar13);
            String::String((String *)local_1588,pcVar13,(long)(int)sVar8);
            std::vector<Value,_std::allocator<Value>_>::push_back
                      (&sFreeArgs.super_vector<Value,_std::allocator<Value>_>,(Value *)local_1590);
            Value::clear((Value *)local_1590);
            uVar10 = (ulong)_optind;
          } while (uVar10 < (ulong)((long)local_15b8.
                                          super__Vector_base<String,_std::allocator<String>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_15b8.
                                          super__Vector_base<String,_std::allocator<String>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 5));
        }
        if ((sAllowsFreeArgs == false) &&
           (sFreeArgs.super_vector<Value,_std::allocator<Value>_>.
            super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            sFreeArgs.super_vector<Value,_std::allocator<Value>_>.
            super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
            _M_finish)) {
          String::format<128ul>((String *)local_1590,"Unexpected free args");
          std::__cxx11::string::operator=((string *)&local_1518,(string *)local_1590);
          if (local_1590 != (undefined1  [8])(local_1588 + 8)) {
            operator_delete((void *)local_1590);
          }
          local_15b9 = false;
        }
        if (local_15b8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_15b8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar12 = 0;
          uVar10 = 0;
          do {
            free(*(void **)((long)&(local_1058->mString)._M_dataplus._M_p + (lVar12 >> 0x1d)));
            uVar10 = uVar10 + 1;
            lVar12 = lVar12 + 0x100000000;
          } while (uVar10 < (ulong)((long)local_15b8.
                                          super__Vector_base<String,_std::allocator<String>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_15b8.
                                          super__Vector_base<String,_std::allocator<String>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 5));
        }
        bVar11 = local_15b9;
        if ((local_15b9 == false) && (local_1510 != 0)) {
          showHelp(_stderr);
          parse((Config *)&local_1518);
          bVar11 = local_15b9;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_14e8.mString._M_dataplus._M_p != &local_14e8.mString.field_2) {
        operator_delete(local_14e8.mString._M_dataplus._M_p);
      }
      if (local_1558 != (void *)0x0) {
        operator_delete(local_1558);
      }
      if ((0x80 < local_40) && (local_48 != (option *)0x0)) {
        operator_delete__(local_48);
      }
      if ((0x80 < local_1050) && (local_1058 != (String *)0x0)) {
        operator_delete__(local_1058);
      }
      std::vector<String,_std::allocator<String>_>::~vector(&local_15b8);
      if (local_1518 != local_1508) {
        operator_delete(local_1518);
      }
      return (bool)(bVar11 & 1);
    }
  } while( true );
}

Assistant:

bool Config::parse(int argc, char **argv, const List<Path> &rcFiles)
{
    String error;
    Rct::findExecutablePath(argv[0]);
    List<String> args;
    args << argv[0];
    for (size_t i=0; i<rcFiles.size(); ++i) {
        FILE *f = fopen(rcFiles.at(i).constData(), "r");
        if (f) {
            char line[1024];
            int read;
            while ((read = Rct::readLine(f, line, sizeof(line))) != -1) {
                char *ch = line;
                while (isspace(*ch))
                    ++ch;
                if (*ch == '#')
                    continue;
                List<String> split = String(ch).split(' '); // ### quoting?
                if (!split.isEmpty()) {
                    String &first = split.first();
                    if (first.size() == 1 || (first.size() > 2 && first.at(1) == '=')) {
                        first.prepend('-');
                    } else {
                        first.prepend("--");
                    }
                    args += split;
                }
            }
            fclose(f);
        }
    }
    for (int i=1; i<argc; ++i)
        args.append(argv[i]);

    // ::error() << "parsing" << args;

    StackBuffer<128, char *> a(args.size());
    for (size_t i=0; i<args.size(); ++i) {
        a[i] = strdup(args.at(i).constData());
    }
    StackBuffer<128, option> options(sOptions.size() + 1);

    List<OptionBase*> optionPointers;
    for (size_t i=0; i<sOptions.size(); ++i) {
        OptionBase *opt = sOptions.at(i);
        if (opt->name) {
            option &o = options[optionPointers.size()];
            optionPointers.append(opt);
            o.name = opt->name;
            o.has_arg = (opt->defaultValue.type() == Value::Type_Boolean) ? no_argument : required_argument; // ### no optional arg?
            o.val = opt->shortOption;
            o.flag = 0;
        }
    }
    memset(&options[optionPointers.size()], 0, sizeof(option));
    const String shortOpts = Rct::shortOptions(options);

    bool ok = true;

    while (true) {
        int idx = -1;
        const int ret = getopt_long(args.size(), a, shortOpts.constData(), options, &idx);
        switch (ret) {
        case -1:
            goto done;
        case '?':
            ok = false;
            goto done;
        default:
            break;
        }
        // error() << optind << ret << optarg;
        // error("%c [%s] [%s]", ret, optarg, a[optind]);

        OptionBase *opt = 0;
        if (idx != -1) {
            opt = optionPointers[idx];
        } else {
            for (size_t i=0; i<optionPointers.size(); ++i) {
                if (optionPointers[i]->shortOption == ret) {
                    opt = optionPointers[i];
                    break;
                }
            }
        }
        if (!opt) {
            ok = false;
            goto done;
        }
        ++opt->count;
        if (optarg) {
            Value val;
            const char *arg = optarg;
            if (optarg[0] == '=' && strcmp(a[optind - 1], optarg)) {
                ++arg;
            }
            val = createValue(opt->type, arg, &ok);
            if (!ok) {
                error = String::format<128>("\"%s\" can not be converted to \"%s\" for %s",
                                            arg, Value::typeToString(opt->type),
                                            opt->name);
                goto done;
            }

            if (opt->defaultValue.type() == Value::Type_List) {
                List<Value> vals;
                vals << val;
                while (static_cast<size_t>(optind) < args.size() && a[optind][0] != '-' && (!opt->listCount || vals.size() < opt->listCount)) {
                    vals << createValue(opt->type, a[optind], &ok);
                    if (!ok) {
                        error = String::format<128>("\"%s\" can not be converted to \"%s\" for %s",
                                                    a[optind], Value::typeToString(opt->type),
                                                    opt->name);
                        goto done;
                    }
                    ++optind;
                }
                opt->value = vals;
                if (opt->listCount && vals.size() != opt->listCount) {
                    ok = false;
#ifdef _WIN32
                    error = String::format<128>("Too few values specified for %s. Wanted %Iu, got %Iu",
#else
                    error = String::format<128>("Too few values specified for %s. Wanted %zu, got %zu",
#endif

                                                opt->name, opt->listCount, vals.size());

                    goto done;
                }
            } else {
                opt->value = val;
            }
            if (!opt->validate(error)) {
                ok = false;
                goto done;
            }
        } else {
            assert(opt->defaultValue.type() == Value::Type_Boolean);
            // must be a toggle arg
            opt->value = Value(!opt->defaultValue.toBool());
        }
    }

done:
    while (static_cast<size_t>(optind) < args.size()) {
        sFreeArgs << a[optind++];
    }
    if (!sAllowsFreeArgs && !sFreeArgs.isEmpty()) {
        error = String::format<128>("Unexpected free args");
        ok = false;
    }

    for (size_t i=0; i<args.size(); ++i) {
        free(a[i]);
    }

    if (!ok) {
        if (!error.isEmpty()) {
            showHelp(stderr);
            fprintf(stderr, "%s\n", error.constData());
        }
    }
    return ok;
}